

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O3

void pystring::split(string *str,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *result,string *sep,int maxsplit)

{
  ulong uVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  int local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string *local_50;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_48;
  ulong local_40;
  ulong local_38;
  
  local_48 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(result,(result->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start);
  local_74 = 0x7fffffff;
  if ((uint)maxsplit < 0x7fffffff) {
    local_74 = maxsplit;
  }
  uVar5 = sep->_M_string_length;
  uVar1 = str->_M_string_length;
  local_50 = str;
  if (uVar5 == 0) {
    if (uVar1 == 0) {
      uVar5 = 0;
    }
    else {
      uVar6 = 0;
      do {
        uVar5 = uVar6;
        pcVar2 = (str->_M_dataplus)._M_p;
        uVar6 = uVar5 + 1;
        if (uVar5 + 1 < uVar1) {
          uVar6 = uVar1;
        }
        while (iVar4 = ::isspace((int)pcVar2[uVar5]), iVar4 != 0) {
          uVar5 = uVar5 + 1;
          if (uVar6 == uVar5) {
            return;
          }
        }
        str = local_50;
        uVar6 = uVar5;
        uVar7 = uVar5;
        if (uVar5 < uVar1) {
          do {
            iVar4 = ::isspace((int)pcVar2[uVar7]);
            str = local_50;
            uVar6 = uVar7;
            if (iVar4 != 0) break;
            uVar7 = uVar7 + 1;
            uVar6 = uVar1;
          } while (uVar1 != uVar7);
          if (uVar5 < uVar6) {
            if (local_74 < 1) break;
            std::__cxx11::string::substr((ulong)&local_70,(ulong)local_50);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>(local_48,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            local_74 = local_74 + -1;
            uVar5 = uVar6;
            if (uVar6 < uVar1) {
              pcVar2 = (str->_M_dataplus)._M_p;
              while (iVar4 = ::isspace((int)pcVar2[uVar6]), uVar5 = uVar6, str = local_50,
                    iVar4 != 0) {
                uVar6 = uVar6 + 1;
                if (uVar1 == uVar6) {
                  return;
                }
              }
            }
          }
        }
      } while (uVar6 < uVar1);
    }
    if (uVar1 <= uVar5) {
      return;
    }
    std::__cxx11::string::substr((ulong)&local_70,(ulong)local_50);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_48,&local_70);
  }
  else {
    if (uVar1 < uVar5) {
      local_40 = 0;
    }
    else {
      uVar6 = 0;
      local_40 = 0;
      uVar7 = uVar5;
      local_38 = uVar5;
      do {
        if ((str->_M_dataplus)._M_p[uVar6] == *(sep->_M_dataplus)._M_p) {
          std::__cxx11::string::substr((ulong)&local_70,(ulong)str);
          _Var3._M_p = local_70._M_dataplus._M_p;
          if (local_70._M_string_length == sep->_M_string_length) {
            if (local_70._M_string_length == 0) {
              bVar8 = true;
            }
            else {
              iVar4 = bcmp(local_70._M_dataplus._M_p,(sep->_M_dataplus)._M_p,
                           local_70._M_string_length);
              bVar8 = iVar4 == 0;
            }
          }
          else {
            bVar8 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var3._M_p != &local_70.field_2) {
            operator_delete(_Var3._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          str = local_50;
          if (!bVar8) goto LAB_00106adc;
          if (local_74 < 1) break;
          std::__cxx11::string::substr((ulong)&local_70,(ulong)local_50);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(local_48,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
          }
          local_74 = local_74 + -1;
          uVar6 = uVar5;
          uVar7 = local_38;
          local_40 = uVar5;
        }
        else {
LAB_00106adc:
          uVar6 = uVar6 + 1;
        }
        uVar5 = uVar6 + uVar7;
      } while (uVar5 <= uVar1);
    }
    std::__cxx11::string::substr((ulong)&local_70,(ulong)str);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_48,&local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void split( const std::string & str, std::vector< std::string > & result, const std::string & sep, int maxsplit )
    {
        result.clear();

        if ( maxsplit < 0 ) maxsplit = MAX_32BIT_INT;//result.max_size();


        if ( sep.size() == 0 )
        {
            split_whitespace( str, result, maxsplit );
            return;
        }

        std::string::size_type i,j, len = str.size(), n = sep.size();

        i = j = 0;

        while ( i+n <= len )
        {
            if ( str[i] == sep[0] && str.substr( i, n ) == sep )
            {
                if ( maxsplit-- <= 0 ) break;

                result.push_back( str.substr( j, i - j ) );
                i = j = i + n;
            }
            else
            {
                i++;
            }
        }

        result.push_back( str.substr( j, len-j ) );
    }